

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O0

void __thiscall PropertyParser::parseReactProperty(PropertyParser *this,string *reactType)

{
  char *pcVar1;
  bool bVar2;
  reference pvVar3;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [8];
  string name;
  string *reactType_local;
  PropertyParser *this_local;
  
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->tokens,1);
  std::__cxx11::string::string(local_38,(string *)pvVar3);
  pcVar1 = w_Bulk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar1,&local_59);
  bVar2 = Utilities::match(reactType,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar1 = w_Wall;
  if (bVar2) {
    parseLinkProperty(this,3,(string *)local_38);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar1,&local_91);
    bVar2 = Utilities::match(reactType,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pcVar1 = w_Tank;
    if (bVar2) {
      parseLinkProperty(this,4,(string *)local_38);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,pcVar1,&local_b9);
      bVar2 = Utilities::match(reactType,(string *)local_b8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      if (bVar2) {
        parseNodeProperty(this,0x13,(string *)local_38);
      }
      else {
        OptionParser::parseReactOption
                  (&this->optionParser,(this->super_InputParser).network,&this->tokens);
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void PropertyParser::parseReactProperty(string& reactType)
{
    string name = tokens[1];
    if ( Utilities::match(reactType, w_Bulk) )
    {
        parseLinkProperty(BULK, name);
    }
    else if ( Utilities::match(reactType, w_Wall) )
    {
        parseLinkProperty(WALL, name);
    }
    else if ( Utilities::match(reactType, w_Tank) )
    {
        parseNodeProperty(InputReader::REACTION, name);
    }
    else optionParser.parseReactOption(network, tokens);
}